

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int unqlite_kv_cursor_seek(unqlite_kv_cursor *pCursor,void *pKey,int nKeyLen,int iPos)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  
  if (nKeyLen < 0) {
    pcVar3 = (char *)pKey;
    if (*pKey != '\0') {
      pcVar1 = (char *)((long)pKey + 2);
      do {
        pcVar3 = pcVar1;
        if (pcVar3[-1] == '\0') {
          pcVar3 = pcVar3 + -1;
          goto LAB_0010e3b7;
        }
        if (*pcVar3 == '\0') goto LAB_0010e3b7;
        if (pcVar3[1] == '\0') {
          pcVar3 = pcVar3 + 1;
          goto LAB_0010e3b7;
        }
        pcVar1 = pcVar3 + 4;
      } while (pcVar3[2] != '\0');
      pcVar3 = pcVar3 + 2;
    }
LAB_0010e3b7:
    nKeyLen = (int)pcVar3 - (int)pKey;
  }
  if (nKeyLen != 0) {
    iVar2 = (*pCursor->pStore->pIo->pMethods->xSeek)(pCursor,pKey,nKeyLen,iPos);
    return iVar2;
  }
  return -3;
}

Assistant:

int unqlite_kv_cursor_seek(unqlite_kv_cursor *pCursor,const void *pKey,int nKeyLen,int iPos)
{
	int rc = UNQLITE_OK;
#ifdef UNTRUST
	if( pCursor == 0 ){
		return UNQLITE_CORRUPT;
	}
#endif
	if( nKeyLen < 0 ){
		/* Assume a null terminated string and compute it's length */
		nKeyLen = SyStrlen((const char *)pKey);
	}
	if( !nKeyLen ){
		rc = UNQLITE_EMPTY;
	}else{
		/* Seek to the desired location */
		rc = pCursor->pStore->pIo->pMethods->xSeek(pCursor,pKey,nKeyLen,iPos);
	}
	return rc;
}